

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O1

void __thiscall
henson::Coroutine<henson::PythonPuppet>::proceed(Coroutine<henson::PythonPuppet> *this)

{
  time_type *ptVar1;
  timespec ts;
  timespec local_20;
  
  clock_gettime(0,&local_20);
  (this->super_BaseCoroutine).start_time_ = local_20.tv_sec * 1000000000 + local_20.tv_nsec;
  coro_transfer(&this->from_,&this->to_);
  clock_gettime(0,&local_20);
  ptVar1 = &(this->super_BaseCoroutine).total_time_;
  *ptVar1 = *ptVar1 + ((local_20.tv_sec * 1000000000 + local_20.tv_nsec) -
                      (this->super_BaseCoroutine).start_time_);
  return;
}

Assistant:

void                proceed()
    {
        start_time_ = get_time();
#ifdef USE_BOOST
        to_ = to_.resume();
#else
        coro_transfer(&from_, &to_);
#endif
        time_type diff = get_time() - start_time_;
        total_time_ += diff;
    }